

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

Value * __thiscall
wabt::Decompiler::Get<(wabt::ExprType)26>
          (Value *__return_storage_ptr__,Decompiler *this,VarExpr<(wabt::ExprType)26> *ve)

{
  string_view sVar1;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((ve->var).type_ == Name) {
    sVar1._M_str = (ve->var).field_2.name_._M_dataplus._M_p;
    sVar1._M_len = (ve->var).field_2.name_._M_string_length;
    sVar1 = VarName(this,sVar1);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,sVar1._M_str,sVar1._M_str + sVar1._M_len);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               local_68,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    __return_storage_ptr__->precedence = Atomic;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                ,0x3e,"const std::string &wabt::Var::name() const");
}

Assistant:

bool Associative(Precedence p) {
    return p == Precedence::Add || p == Precedence::Multiply;
  }